

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManCreateMiter(Aig_Man_t *p1,Aig_Man_t *p2,int Oper)

{
  void *pvVar1;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  long lVar7;
  
  if (p1->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(p1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x41e,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p2->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x41f,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p1->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(p1) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x420,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p2->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(p2) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x421,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p1->nObjs[2] != p2->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p1) == Aig_ManCiNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x422,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  p = Aig_ManStart(p2->vObjs->nSize + p1->vObjs->nSize);
  p1->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar4 = p1->vCis;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar7];
      pAVar2 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
      lVar7 = lVar7 + 1;
      pVVar4 = p1->vCis;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = p1->vObjs;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar7];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006bd910;
        uVar3 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          pAVar2 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar2 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar3 + 0x28));
        }
        uVar3 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar3 + 0x28));
        }
        pAVar2 = Aig_And(p,pAVar2,pAVar6);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
        pVVar4 = p1->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  p2->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar4 = p2->vCis;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      if (p->vCis->nSize <= lVar7) goto LAB_006bd8f1;
      *(void **)((long)pVVar4->pArray[lVar7] + 0x28) = p->vCis->pArray[lVar7];
      lVar7 = lVar7 + 1;
      pVVar4 = p2->vCis;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = p2->vObjs;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar7];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006bd910;
        uVar3 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          pAVar2 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar2 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar3 + 0x28));
        }
        uVar3 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar3 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar3 + 0x28));
        }
        pAVar2 = Aig_And(p,pAVar2,pAVar6);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
        pVVar4 = p2->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  switch(Oper) {
  case 0:
    if (p1->vCos->nSize < 1) goto LAB_006bd8f1;
    pvVar1 = *p1->vCos->pArray;
    if (((ulong)pvVar1 & 1) != 0) goto LAB_006bd910;
    uVar3 = *(ulong *)((long)pvVar1 + 8);
    uVar5 = uVar3 & 0xfffffffffffffffe;
    if (uVar5 == 0) {
      pAVar2 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28));
    }
    if (p2->vCos->nSize < 1) goto LAB_006bd8f1;
    pvVar1 = *p2->vCos->pArray;
    if (((ulong)pvVar1 & 1) != 0) goto LAB_006bd910;
    uVar3 = *(ulong *)((long)pvVar1 + 8);
    uVar5 = uVar3 & 0xfffffffffffffffe;
    if (uVar5 == 0) {
      pAVar6 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28));
    }
    pAVar2 = Aig_Exor(p,pAVar2,pAVar6);
    goto LAB_006bd8cc;
  case 1:
    if (p1->vCos->nSize < 1) goto LAB_006bd8f1;
    pvVar1 = *p1->vCos->pArray;
    if (((ulong)pvVar1 & 1) != 0) goto LAB_006bd910;
    uVar3 = *(ulong *)((long)pvVar1 + 8);
    uVar5 = uVar3 & 0xfffffffffffffffe;
    if (uVar5 == 0) {
      pAVar2 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28));
    }
    if (p2->vCos->nSize < 1) goto LAB_006bd8f1;
    pvVar1 = *p2->vCos->pArray;
    if (((ulong)pvVar1 & 1) != 0) goto LAB_006bd910;
    uVar3 = *(ulong *)((long)pvVar1 + 8);
    uVar5 = uVar3 & 0xfffffffffffffffe;
    if (uVar5 == 0) {
      pAVar6 = (Aig_Obj_t *)0x1;
    }
    else {
      pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28) ^ 1);
    }
    break;
  case 2:
    if (0 < p1->vCos->nSize) {
      pvVar1 = *p1->vCos->pArray;
      if (((ulong)pvVar1 & 1) == 0) {
        uVar3 = *(ulong *)((long)pvVar1 + 8);
        uVar5 = uVar3 & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar2 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar2 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        if (p2->vCos->nSize < 1) goto LAB_006bd8f1;
        pvVar1 = *p2->vCos->pArray;
        if (((ulong)pvVar1 & 1) == 0) {
          uVar3 = *(ulong *)((long)pvVar1 + 8);
          uVar5 = uVar3 & 0xfffffffffffffffe;
          if (uVar5 == 0) {
            pAVar6 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28));
          }
          pAVar2 = Aig_Or(p,pAVar2,pAVar6);
          goto LAB_006bd8cc;
        }
      }
LAB_006bd910:
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
    }
LAB_006bd8f1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  case 3:
    if (p1->vCos->nSize < 1) goto LAB_006bd8f1;
    pvVar1 = *p1->vCos->pArray;
    if (((ulong)pvVar1 & 1) != 0) goto LAB_006bd910;
    uVar3 = *(ulong *)((long)pvVar1 + 8);
    uVar5 = uVar3 & 0xfffffffffffffffe;
    if (uVar5 == 0) {
      pAVar2 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28));
    }
    if (p2->vCos->nSize < 1) goto LAB_006bd8f1;
    pvVar1 = *p2->vCos->pArray;
    if (((ulong)pvVar1 & 1) != 0) goto LAB_006bd910;
    uVar3 = *(ulong *)((long)pvVar1 + 8);
    uVar5 = uVar3 & 0xfffffffffffffffe;
    if (uVar5 == 0) {
      pAVar6 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar5 + 0x28));
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x43a,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  pAVar2 = Aig_And(p,pAVar2,pAVar6);
LAB_006bd8cc:
  Aig_ObjCreateCo(p,pAVar2);
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Aig_ManCreateMiter( Aig_Man_t * p1, Aig_Man_t * p2, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i;
    assert( Aig_ManRegNum(p1) == 0 );
    assert( Aig_ManRegNum(p2) == 0 );
    assert( Aig_ManCoNum(p1) == 1 );
    assert( Aig_ManCoNum(p2) == 1 );
    assert( Aig_ManCiNum(p1) == Aig_ManCiNum(p2) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p1) + Aig_ManObjNumMax(p2) );
    // add first AIG
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add second AIG
    Aig_ManConst1(p2)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p2, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    Aig_ManForEachNode( p2, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the output
    if ( Oper == 0 ) // XOR
        pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_ObjChild0Copy(Aig_ManCo(p2,0)) );
    else if ( Oper == 1 ) // implication is PO(p1) -> PO(p2)  ...  complement is PO(p1) & !PO(p2) 
        pObj = Aig_And( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p2,0))) );
    else if ( Oper == 2 ) // OR
        pObj = Aig_Or( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_ObjChild0Copy(Aig_ManCo(p2,0)) );
    else if ( Oper == 3 ) // AND
        pObj = Aig_And( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_ObjChild0Copy(Aig_ManCo(p2,0)) );
    else
        assert( 0 );
    Aig_ObjCreateCo( pNew, pObj );
    Aig_ManCleanup( pNew );
    return pNew;
}